

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QDate __thiscall
QLocale::toDate(QLocale *this,QString *string,FormatType format,QCalendar cal,int baseYear)

{
  long lVar1;
  QDate QVar2;
  QLocale *in_RCX;
  FormatType in_EDX;
  QLocale *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QCalendar in_stack_00000090;
  QString *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dateFormat(in_RSI,in_EDX);
  QVar2 = toDate(in_RCX,in_stack_ffffffffffffffc8,in_RDI,in_stack_00000090,
                 (int)((ulong)in_RSI >> 0x20));
  QString::~QString((QString *)0x4cf7a4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDate)QVar2.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QLocale::toDate(const QString &string, FormatType format, QCalendar cal, int baseYear) const
{
    return toDate(string, dateFormat(format), cal, baseYear);
}